

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vector<Cards,_std::allocator<Cards>_> *v)

{
  size_type sVar1;
  reference card;
  int local_1c;
  int i;
  vector<Cards,_std::allocator<Cards>_> *v_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<Cards,_std::allocator<Cards>_>::size(v);
    if (sVar1 <= (ulong)(long)local_1c) break;
    card = std::vector<Cards,_std::allocator<Cards>_>::operator[](v,(long)local_1c);
    operator<<(os,card);
    sVar1 = std::vector<Cards,_std::allocator<Cards>_>::size(v);
    if ((long)local_1c != sVar1 - 1) {
      std::operator<<(os,", ");
    }
    local_1c = local_1c + 1;
  }
  std::operator<<(os,"]\n");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, vector<Cards> v)
{
    os << "[";
    for (int i = 0; i < v.size(); ++i) {
        os << v[i];
        if (i != v.size() - 1)
            os << ", ";
    }
    os << "]\n";
    return os;
}